

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O2

int is_ref_frame_used_in_cache(MV_REFERENCE_FRAME ref_frame,MB_MODE_INFO *mi_cache)

{
  char cVar1;
  bool bVar2;
  
  if (mi_cache == (MB_MODE_INFO *)0x0) {
    bVar2 = false;
  }
  else {
    if (ref_frame < '\b') {
      bVar2 = true;
      if (mi_cache->ref_frame[0] == ref_frame) goto LAB_001f84c0;
      cVar1 = mi_cache->ref_frame[1];
    }
    else {
      cVar1 = av1_ref_frame_type(mi_cache->ref_frame);
    }
    bVar2 = cVar1 == ref_frame;
  }
LAB_001f84c0:
  return (int)bVar2;
}

Assistant:

static inline int is_ref_frame_used_in_cache(MV_REFERENCE_FRAME ref_frame,
                                             const MB_MODE_INFO *mi_cache) {
  if (!mi_cache) {
    return 0;
  }

  if (ref_frame < REF_FRAMES) {
    return (ref_frame == mi_cache->ref_frame[0] ||
            ref_frame == mi_cache->ref_frame[1]);
  }

  // if we are here, then the current mode is compound.
  MV_REFERENCE_FRAME cached_ref_type = av1_ref_frame_type(mi_cache->ref_frame);
  return ref_frame == cached_ref_type;
}